

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  long lVar2;
  size_t sVar3;
  byte bVar4;
  byte *pbVar5;
  byte bVar6;
  long lVar7;
  byte *s_00;
  gap g;
  gap local_48;
  
  local_48.end = (char_t *)0x0;
  local_48.size = 0;
  if (((anonymous_namespace)::chartype_table[(byte)*s] & 8) != 0) {
    local_48.size = 0;
    do {
      lVar7 = local_48.size + 1;
      local_48.size = local_48.size + 1;
    } while (((anonymous_namespace)::chartype_table[(byte)s[lVar7]] & 8) != 0);
    s = s + local_48.size;
    local_48.end = s;
  }
  do {
    sVar3 = local_48.size;
    bVar4 = *s;
    bVar6 = (anonymous_namespace)::chartype_table[bVar4];
    s_00 = (byte *)s;
    if ((bVar6 & 0xc) == 0) {
      pbVar5 = (byte *)s + 2;
      do {
        s_00 = pbVar5;
        bVar4 = s_00[-1];
        bVar6 = (anonymous_namespace)::chartype_table[bVar4];
        if ((bVar6 & 0xc) != 0) {
          s_00 = s_00 + -1;
          goto LAB_001104e4;
        }
        bVar4 = *s_00;
        bVar6 = (anonymous_namespace)::chartype_table[bVar4];
        if ((bVar6 & 0xc) != 0) goto LAB_001104e4;
        bVar4 = s_00[1];
        bVar6 = (anonymous_namespace)::chartype_table[bVar4];
        if ((bVar6 & 0xc) != 0) {
          s_00 = s_00 + 1;
          goto LAB_001104e4;
        }
        bVar4 = s_00[2];
        bVar6 = (anonymous_namespace)::chartype_table[bVar4];
        pbVar5 = s_00 + 4;
      } while ((bVar6 & 0xc) == 0);
      s_00 = s_00 + 2;
    }
LAB_001104e4:
    if (bVar4 == end_quote) {
      pbVar5 = s_00;
      if ((byte *)local_48.end != (byte *)0x0) {
        memmove(local_48.end + -local_48.size,local_48.end,(long)s_00 - (long)local_48.end);
        pbVar5 = s_00 + -sVar3;
      }
      do {
        *pbVar5 = 0;
        pbVar1 = pbVar5 + -1;
        pbVar5 = pbVar5 + -1;
      } while (((anonymous_namespace)::chartype_table[*pbVar1] & 8) != 0);
      return (char_t *)(s_00 + 1);
    }
    if ((bVar6 & 8) == 0) {
      if (bVar4 == 0x26) {
        s = strconv_escape((char_t *)s_00,&local_48);
      }
      else {
        if (bVar4 == 0) {
          return (char_t *)0x0;
        }
        s = (char_t *)(s_00 + 1);
      }
    }
    else {
      s = (char_t *)(s_00 + 1);
      *s_00 = 0x20;
      if (((anonymous_namespace)::chartype_table[s_00[1]] & 8) != 0) {
        lVar7 = 0;
        do {
          lVar2 = lVar7 + 2;
          lVar7 = lVar7 + 1;
        } while (((anonymous_namespace)::chartype_table[s_00[lVar2]] & 8) != 0);
        if ((byte *)local_48.end != (byte *)0x0) {
          memmove(local_48.end + -local_48.size,local_48.end,(long)s - (long)local_48.end);
        }
        s = (char_t *)((byte *)s + lVar7);
        local_48.size = sVar3 + lVar7;
        local_48.end = s;
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}